

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O3

void tlb_flush_one_mmuidx_locked(CPUArchState_conflict30 *env,int mmu_idx,int64_t now)

{
  ulong uVar1;
  void *__s;
  uc_struct_conflict15 *uc;
  MemoryRegion *mr;
  hwaddr hVar2;
  long lVar3;
  ulong uVar4;
  gpointer pvVar5;
  MemoryRegionSection *pMVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  uint extraout_EDX;
  undefined8 *puVar10;
  hwaddr *phVar11;
  MemOp op;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  uint32_t *puVar15;
  ulong uVar16;
  gsize __n;
  gsize n_blocks;
  bool bVar17;
  uint64_t uStack_60;
  undefined8 *puStack_58;
  uint32_t *puStack_50;
  ulong uStack_48;
  ulong uStack_40;
  undefined8 uStack_38;
  
  lVar8 = (long)mmu_idx;
  lVar3 = lVar8 * 0x2b0;
  puVar10 = (undefined8 *)((long)env + lVar3 + -0x850);
  uVar9 = lVar8 * 0x10;
  uVar12 = *(ulong *)(env->gpr_a + lVar8 * 4 + -0x10);
  uVar13 = (uVar12 >> 6) + 1;
  uVar16 = *(ulong *)((long)env + lVar3 + -0x840);
  uVar1 = *(ulong *)((long)env + lVar3 + -0x838);
  if (uVar16 < uVar1) {
    *(ulong *)((long)env + lVar3 + -0x840) = uVar1;
    uVar16 = uVar1;
  }
  puVar15 = env->gpr_a + lVar8 * 4 + -0x10;
  lVar14 = *(long *)((long)env + lVar3 + -0x848) + 100000000;
  uVar4 = (uVar16 * 100) / uVar13;
  if (uVar4 < 0x47) {
    if ((uVar4 < 0x1e) && (lVar14 < now)) {
      uVar9 = 0x40;
      uVar4 = uVar16 - 1;
      if (uVar4 != 0) {
        uVar9 = 0x3f;
        if (uVar4 != 0) {
          for (; uVar4 >> uVar9 == 0; uVar9 = uVar9 - 1) {
          }
        }
        uVar9 = uVar9 ^ 0x3f;
      }
      iVar7 = (int)uVar9 + -1;
      uVar4 = (ulong)(uVar16 == 0);
      if (uVar9 != 0) {
        uVar4 = 0x8000000000000000 >> ((byte)iVar7 & 0x3f);
      }
      bVar17 = 0x46 < (uVar16 * 100) / uVar4;
      uVar9 = (ulong)CONCAT31((int3)((uint)iVar7 >> 8),bVar17);
      uVar4 = uVar4 << bVar17;
      n_blocks = 0x40;
      if (0x40 < uVar4) {
        n_blocks = uVar4;
      }
      goto LAB_00d154dd;
    }
  }
  else {
    n_blocks = 0x40000;
    if (uVar13 * 2 < 0x40000) {
      n_blocks = uVar13 * 2;
    }
LAB_00d154dd:
    if (n_blocks != uVar13) {
      g_free(*(gpointer *)(env->gpr_a + lVar8 * 4 + -0xe));
      g_free(*(gpointer *)((long)env + lVar3 + -0x5a8));
      *(int64_t *)((long)env + lVar3 + -0x848) = now;
      *(undefined8 *)((long)env + lVar3 + -0x840) = 0;
      *(gsize *)puVar15 = n_blocks * 0x40 - 0x40;
      pvVar5 = g_try_malloc_n(n_blocks,0x40);
      *(gpointer *)(env->gpr_a + lVar8 * 4 + -0xe) = pvVar5;
      phVar11 = (hwaddr *)0x10;
      pvVar5 = g_try_malloc_n(n_blocks,0x10);
      *(gpointer *)((long)env + lVar3 + -0x5a8) = pvVar5;
      if (pvVar5 != (gpointer)0x0) {
        phVar11 = (hwaddr *)0x0;
        memset(pvVar5,0,n_blocks << 4);
      }
      while( true ) {
        op = (MemOp)uVar12;
        pvVar5 = *(gpointer *)(env->gpr_a + lVar8 * 4 + -0xe);
        if ((pvVar5 != (gpointer)0x0) && (*(long *)((long)env + lVar3 + -0x5a8) != 0)) break;
        if (n_blocks == 0x40) {
          tlb_flush_one_mmuidx_locked_cold_1();
          uStack_38 = 0x40;
          uc = *(uc_struct_conflict15 **)((long)pvVar5 + -0x888);
          puStack_58 = puVar10;
          puStack_50 = puVar15;
          uStack_48 = uVar16;
          uStack_40 = n_blocks;
          pMVar6 = iotlb_to_section_tricore
                             ((CPUState *)((long)pvVar5 + -0x8a30),*phVar11,
                              *(MemTxAttrs *)(phVar11 + 1));
          mr = pMVar6->mr;
          hVar2 = *phVar11;
          *(ulong *)((long)pvVar5 + -0x8b8) = uVar9;
          if (*(int *)((long)pvVar5 + -0x894) == 0) {
            cpu_io_recompile_tricore((CPUState *)((long)pvVar5 + -0x8a30),uVar9);
          }
          memory_region_dispatch_read_tricore
                    (uc,(MemoryRegion_conflict *)mr,
                     (ulong)extraout_EDX + (ulong)((uint)hVar2 & 0xffffc000),&uStack_60,op,
                     *(MemTxAttrs *)(phVar11 + 1));
          return;
        }
        n_blocks = n_blocks >> 1;
        if (n_blocks < 0x41) {
          n_blocks = 0x40;
        }
        *(gsize *)puVar15 = n_blocks * 0x40 - 0x40;
        g_free(pvVar5);
        g_free(*(gpointer *)((long)env + lVar3 + -0x5a8));
        pvVar5 = g_try_malloc_n(n_blocks,0x40);
        *(gpointer *)(env->gpr_a + lVar8 * 4 + -0xe) = pvVar5;
        phVar11 = (hwaddr *)0x10;
        pvVar5 = g_try_malloc_n(n_blocks,0x10);
        *(gpointer *)((long)env + lVar3 + -0x5a8) = pvVar5;
      }
      uVar12 = *(ulong *)puVar15;
      goto LAB_00d155e0;
    }
  }
  if (lVar14 < now) {
    *(int64_t *)((long)env + lVar3 + -0x848) = now;
    *(ulong *)((long)env + lVar3 + -0x840) = uVar1;
  }
LAB_00d155e0:
  __s = *(void **)(env->gpr_a + lVar8 * 4 + -0xe);
  *(undefined8 *)((long)env + lVar3 + -0x838) = 0;
  *(undefined8 *)((long)env + lVar3 + -0x830) = 0;
  *puVar10 = 0xffffffffffffffff;
  memset(__s,0xff,uVar12 + 0x40);
  memset((void *)((long)env + lVar3 + -0x828),0xff,0x200);
  return;
}

Assistant:

static void tlb_flush_one_mmuidx_locked(CPUArchState *env, int mmu_idx,
                                        int64_t now)
{
    CPUTLBDesc *desc = &env_tlb(env)->d[mmu_idx];
    CPUTLBDescFast *fast = &env_tlb(env)->f[mmu_idx];

    tlb_mmu_resize_locked(env->uc, desc, fast, now);
    tlb_mmu_flush_locked(desc, fast);
}